

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_proxy.cpp
# Opt level: O0

void __thiscall TcpProxy::start(TcpProxy *this)

{
  element_type *peVar1;
  anon_class_8_1_8991fb9c local_98;
  ConnCallback local_90;
  anon_class_8_1_8991fb9c local_70;
  ConnCallback local_68;
  anon_class_8_1_8991fb9c local_38;
  ConnCallback local_30;
  TcpProxy *local_10;
  TcpProxy *this_local;
  
  local_10 = this;
  peVar1 = std::__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->proxyServer_);
  local_38.this = this;
  std::function<void(Liby::Connection&)>::
  function<TcpProxy::start()::_lambda(Liby::Connection&)_1_,void>
            ((function<void(Liby::Connection&)> *)&local_30,&local_38);
  Liby::TcpServer::onAccept(peVar1,&local_30);
  std::function<void_(Liby::Connection_&)>::~function(&local_30);
  peVar1 = std::__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->proxyServer_);
  local_70.this = this;
  std::function<void(Liby::Connection&)>::
  function<TcpProxy::start()::_lambda(Liby::Connection&)_2_,void>
            ((function<void(Liby::Connection&)> *)&local_68,&local_70);
  Liby::TcpServer::onRead(peVar1,&local_68);
  std::function<void_(Liby::Connection_&)>::~function(&local_68);
  peVar1 = std::__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->proxyServer_);
  local_98.this = this;
  std::function<void(Liby::Connection&)>::
  function<TcpProxy::start()::_lambda(Liby::Connection&)_3_,void>
            ((function<void(Liby::Connection&)> *)&local_90,&local_98);
  Liby::TcpServer::onErro(peVar1,&local_90);
  std::function<void_(Liby::Connection_&)>::~function(&local_90);
  return;
}

Assistant:

void start() {
        proxyServer_->onAccept([this](Connection &conn) { onAccept(conn); });
        proxyServer_->onRead(
            [this](Connection &conn) { handleConnectRequest(conn); });
        proxyServer_->onErro([this](Connection &conn) { onErro(conn); });
    }